

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Ref cashew::ValueBuilder::makeVar(bool is_const)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  Value *this;
  void *__ptr;
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = cashew::Value::setArray(pVVar2,2);
  __ptr = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar3.inst)->type = Null;
  cashew::Value::free(RVar3.inst,__ptr);
  (RVar3.inst)->type = String;
  pcVar1 = DAT_010d1540;
  ((RVar3.inst)->field_1).str.str._M_len = VAR;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar3);
  this = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  this->type = Null;
  RVar3.inst = cashew::Value::setArray(this,0);
  RVar3.inst = cashew::Value::push_back(pVVar2,RVar3);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeVar(bool is_const = false) {
    return &makeRawArray(2)
              ->push_back(makeRawString(VAR))
              .push_back(makeRawArray());
  }